

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef lj_crecord_loadiu64(jit_State *J,TRef tr,cTValue *o)

{
  uint16_t uVar1;
  ushort uVar2;
  TRef TVar3;
  GCcdata *pGVar4;
  CTypeID id;
  cTValue *o_local;
  TRef tr_local;
  jit_State *J_local;
  
  pGVar4 = argv2cdata(J,tr,o);
  uVar1 = pGVar4->ctypeid;
  if ((uVar1 != 0xb) && (uVar1 != 0xc)) {
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  uVar2 = 0x16;
  if (uVar1 == 0xb) {
    uVar2 = 0x15;
  }
  (J->fold).ins.field_0.ot = uVar2 | 0x4500;
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  (J->fold).ins.field_0.op2 = 0x19;
  TVar3 = lj_opt_fold(J);
  return TVar3;
}

Assistant:

TRef lj_crecord_loadiu64(jit_State *J, TRef tr, cTValue *o)
{
  CTypeID id = argv2cdata(J, tr, o)->ctypeid;
  if (!(id == CTID_INT64 || id == CTID_UINT64))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  lj_needsplit(J);
  return emitir(IRT(IR_FLOAD, id == CTID_INT64 ? IRT_I64 : IRT_U64), tr,
		IRFL_CDATA_INT64);
}